

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O0

int CVBBDPrecInitB(void *cvode_mem,int which,sunindextype NlocalB,sunindextype mudqB,
                  sunindextype mldqB,sunindextype mukeepB,sunindextype mlkeepB,sunrealtype dqrelyB,
                  CVLocalFnB glocB,CVCommFnB cfnB)

{
  undefined8 *puVar1;
  int in_ESI;
  CVodeMem in_RDI;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  int flag;
  void *cvodeB_mem;
  CVBBDPrecDataB cvbbdB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_00000070;
  sunindextype in_stack_00000080;
  sunindextype in_stack_00000088;
  CVLocalFn in_stack_000000b0;
  CVCommFn in_stack_000000b8;
  code *pcVar2;
  code *pcVar3;
  CVodeBMemRec *local_58;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x308,"CVBBDPrecInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x311,"CVBBDPrecInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Illegal attempt to call before calling CVodeAdjInit.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->cv_adj_mem->ca_nbckpbs) {
    for (local_58 = in_RDI->cv_adj_mem->cvB_mem;
        (local_58 != (CVodeBMemRec *)0x0 && (in_ESI != local_58->cv_index));
        local_58 = local_58->cv_next) {
    }
    pcVar2 = cvGlocWrapper;
    pcVar3 = cvCfnWrapper;
    local_4 = CVBBDPrecInit(glocB,mlkeepB,in_stack_00000088,in_stack_00000080,
                            (sunindextype)cvode_mem,CONCAT44(which,in_stack_00000070),
                            (sunrealtype)NlocalB,in_stack_000000b0,in_stack_000000b8);
    if (local_4 == 0) {
      puVar1 = (undefined8 *)malloc(0x10);
      if (puVar1 == (undefined8 *)0x0) {
        cvProcessError(in_RDI,-4,0x335,"CVBBDPrecInitB",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                       ,"A memory request failed.",pcVar2,pcVar3);
        local_4 = -4;
      }
      else {
        *puVar1 = in_stack_00000010;
        puVar1[1] = in_stack_00000018;
        local_58->cv_pmem = puVar1;
        local_58->cv_pfree = CVBBDPrecFreeB;
        local_4 = 0;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-3,0x31a,"CVBBDPrecInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Illegal value for the which parameter.");
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int CVBBDPrecInitB(void* cvode_mem, int which, sunindextype NlocalB,
                   sunindextype mudqB, sunindextype mldqB, sunindextype mukeepB,
                   sunindextype mlkeepB, sunrealtype dqrelyB, CVLocalFnB glocB,
                   CVCommFnB cfnB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVBBDPrecDataB cvbbdB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSGBBD_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    /* advance */
    cvB_mem = cvB_mem->cv_next;
  }
  /* cv_mem corresponding to 'which' problem. */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  /* Initialize the BBD preconditioner for this backward problem. */
  flag = CVBBDPrecInit(cvodeB_mem, NlocalB, mudqB, mldqB, mukeepB, mlkeepB,
                       dqrelyB, cvGlocWrapper, cvCfnWrapper);
  if (flag != CV_SUCCESS) { return (flag); }

  /* Allocate memory for CVBBDPrecDataB to store the user-provided
     functions which will be called from the wrappers */
  cvbbdB_mem = NULL;
  cvbbdB_mem = (CVBBDPrecDataB)malloc(sizeof(*cvbbdB_mem));
  if (cvbbdB_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* set pointers to user-provided functions */
  cvbbdB_mem->glocB = glocB;
  cvbbdB_mem->cfnB  = cfnB;

  /* Attach pmem and pfree */
  cvB_mem->cv_pmem  = cvbbdB_mem;
  cvB_mem->cv_pfree = CVBBDPrecFreeB;

  return (CVLS_SUCCESS);
}